

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_parse(secp256k1_scalar *rr,secp256k1_scalar *rs,uchar *sig,size_t size)

{
  long in_RCX;
  uchar *in_RDX;
  size_t rlen;
  uchar *sigend;
  size_t local_38;
  uchar *local_30;
  uchar *local_20 [3];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  local_30 = in_RDX + in_RCX;
  if ((in_RDX == local_30) || (local_20[0] = in_RDX + 1, *in_RDX != '0')) {
    iVar1 = 0;
  }
  else {
    iVar1 = secp256k1_der_read_len(&local_38,local_20,local_30);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else if (local_38 == (long)local_30 - (long)local_20[0]) {
      iVar1 = secp256k1_der_parse_integer
                        ((secp256k1_scalar *)sigend,(uchar **)rlen,
                         (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = secp256k1_der_parse_integer
                          ((secp256k1_scalar *)sigend,(uchar **)rlen,
                           (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else if (local_20[0] == local_30) {
          iVar1 = 1;
        }
        else {
          iVar1 = 0;
        }
      }
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_ecdsa_sig_parse(secp256k1_scalar *rr, secp256k1_scalar *rs, const unsigned char *sig, size_t size) {
    const unsigned char *sigend = sig + size;
    size_t rlen;
    if (sig == sigend || *(sig++) != 0x30) {
        /* The encoding doesn't start with a constructed sequence (X.690-0207 8.9.1). */
        return 0;
    }
    if (secp256k1_der_read_len(&rlen, &sig, sigend) == 0) {
        return 0;
    }
    if (rlen != (size_t)(sigend - sig)) {
        /* Tuple exceeds bounds or garage after tuple. */
        return 0;
    }

    if (!secp256k1_der_parse_integer(rr, &sig, sigend)) {
        return 0;
    }
    if (!secp256k1_der_parse_integer(rs, &sig, sigend)) {
        return 0;
    }

    if (sig != sigend) {
        /* Trailing garbage inside tuple. */
        return 0;
    }

    return 1;
}